

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

int nghttp2_session_recv(nghttp2_session *session)

{
  ulong inlen;
  ulong uVar1;
  uint8_t buf [16384];
  uint8_t auStack_4018 [16384];
  
  while( true ) {
    inlen = (*(session->callbacks).recv_callback)(session,auStack_4018,0x4000,0,session->user_data);
    if ((long)inlen < 1) break;
    if (0x4000 < inlen) goto LAB_0056b1bd;
    uVar1 = nghttp2_session_mem_recv(session,auStack_4018,inlen);
    if ((long)uVar1 < 0) goto LAB_0056b1c2;
    if (uVar1 != inlen) {
      __assert_fail("proclen == readlen",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                    ,0x1cc7,"int nghttp2_session_recv(nghttp2_session *)");
    }
  }
  if (inlen == 0xfffffffffffffe05) {
    uVar1 = 0xfffffe05;
    goto LAB_0056b1c2;
  }
  uVar1 = 0;
  if ((inlen == 0xfffffffffffffe08) || (inlen == 0)) goto LAB_0056b1c2;
LAB_0056b1bd:
  uVar1 = 0xfffffc7a;
LAB_0056b1c2:
  return (int)uVar1;
}

Assistant:

int nghttp2_session_recv(nghttp2_session *session) {
  uint8_t buf[NGHTTP2_INBOUND_BUFFER_LENGTH];
  while (1) {
    ssize_t readlen;
    readlen = session_recv(session, buf, sizeof(buf));
    if (readlen > 0) {
      ssize_t proclen = nghttp2_session_mem_recv(session, buf, (size_t)readlen);
      if (proclen < 0) {
        return (int)proclen;
      }
      assert(proclen == readlen);
    } else if (readlen == 0 || readlen == NGHTTP2_ERR_WOULDBLOCK) {
      return 0;
    } else if (readlen == NGHTTP2_ERR_EOF) {
      return NGHTTP2_ERR_EOF;
    } else if (readlen < 0) {
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    }
  }
}